

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_FundRawTransaction_MillionAmountValue_Test::
~ElementsTransactionApi_FundRawTransaction_MillionAmountValue_Test
          (ElementsTransactionApi_FundRawTransaction_MillionAmountValue_Test *this)

{
  void *in_RDI;
  
  ~ElementsTransactionApi_FundRawTransaction_MillionAmountValue_Test
            ((ElementsTransactionApi_FundRawTransaction_MillionAmountValue_Test *)0x2e3708);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_MillionAmountValue) {
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{300000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = exp_dummy_asset_a;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{400000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = exp_dummy_asset_a;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{300000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = exp_dummy_asset_a;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address1 = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");
  Address address3 = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");

  ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
      address1, key.DerivePubkey(91).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
      address2, key.DerivePubkey(92).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
      address3, key.DerivePubkey(93).GetPubkey());

  double fee_rate = 0.11;
  ConfidentialAssetId fee_asset = exp_dummy_asset_a;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{0}));
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), reserve_ct_addr3.GetAddress());
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  txc.AddTxOut(reserve_ct_addr1, utxo1.amount + utxo3.amount - fee, exp_dummy_asset_a);
  txc.AddTxOut(reserve_ct_addr2, utxo2.amount, exp_dummy_asset_a);

  ElementsTransactionApi api;
  ConfidentialTransactionController ctx = api.FundRawTransaction(
      txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
      reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
      &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);

  txc = ConfidentialTransactionContext(ctx.GetHex());
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402206454682354c6da513edad5380f2e83fffcae69d5004c61fee3452f371596b6d20220413f7978b23b25da56afd237db9f6532256a2962e400e4bbf01f70f318725cc401210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff040100000000000000000000000000000000000000000000000000000000000000aa01000221b262dd58f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000aa0100016bcc41e9000002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000001b500000100000000000000000000000000000000000000000000000000000000000000aa01000000000000255b029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e40000000000000247304402201f8ab340cc5c6c85ff01f8cb48649ae111f0eecefce996cee79835270942631d02207f2d32c047ed8b3b02e9bca2d9c237243bb3564ccb353fca9678844eb36c691701210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000002473044022061d1a2c6903da2571ca14cfcdcec006ac3b95dc10a75b34d73b0a426003ba6c0022058e7453692dbe1d23c4f2676d567f04a737791edc025004c3c553bab6cec81d301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000000000000000000000");
  EXPECT_EQ(txc.GetVsize(), 662);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(fee_rate * 100) / 100;
  EXPECT_EQ(minimum_fee, 72);
}